

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BOOLEAN __thiscall BVStatic<65536UL>::TestIntrinsic(BVStatic<65536UL> *this,BVIndex i)

{
  BVIndex i_local;
  BVStatic<65536UL> *this_local;
  uchar retval;
  
  AssertRange(this,i);
  return (*(byte *)((long)&this->data[0].word + ((long)(int)i >> 3)) >> (i & 7) & 1) != 0;
}

Assistant:

BOOLEAN TestIntrinsic(BVIndex i) const
    {
        AssertRange(i);
        return PlatformAgnostic::_BitTest((LONG *)this->data, (LONG) i);
    }